

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeLangevin::moveA(FluctuatingChargeLangevin *this)

{
  double dVar1;
  double dVar2;
  pointer ppAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  long lVar6;
  long lVar7;
  Molecule *pMVar8;
  pointer ppAVar9;
  Atom *pAVar10;
  long lVar11;
  double dVar12;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar8 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    while (pMVar8 != (Molecule *)0x0) {
      ppAVar9 = (pMVar8->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar8->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar9 != ppAVar3) goto LAB_0020f98b;
      pAVar10 = (Atom *)0x0;
      while (pAVar10 != (Atom *)0x0) {
        DVar4 = (pAVar10->super_StuntDouble).storage_;
        pSVar5 = ((pAVar10->super_StuntDouble).snapshotMan_)->currentSnapshot_;
        lVar11 = (long)(pAVar10->super_StuntDouble).localIndex_;
        lVar6 = *(long *)((long)&(pSVar5->atomData).flucQPos.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar4);
        lVar7 = *(long *)((long)&(pSVar5->atomData).flucQVel.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar4);
        dVar12 = (*(double *)
                   (*(long *)((long)&(pSVar5->atomData).flucQFrc.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + DVar4) + lVar11 * 8) *
                 this->dt2_) / pAVar10->chargeMass_ + *(double *)(lVar7 + lVar11 * 8);
        dVar1 = this->dt_;
        dVar2 = *(double *)(lVar6 + lVar11 * 8);
        *(double *)(lVar7 + lVar11 * 8) = dVar12;
        *(double *)(lVar6 + lVar11 * 8) = dVar1 * dVar12 + dVar2;
        ppAVar9 = ppAVar9 + 1;
        pAVar10 = (Atom *)0x0;
        if (ppAVar9 != ppAVar3) {
LAB_0020f98b:
          pAVar10 = *ppAVar9;
        }
      }
      pMVar8 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeLangevin::moveA() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos, cfrc, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cpos  = atom->getFlucQPos();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass;
        // position whole step
        cpos += dt_ * cvel;

        atom->setFlucQVel(cvel);
        atom->setFlucQPos(cpos);
      }
    }
  }